

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValueTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_ComparatorsAndCopiersRepository_ComparatorAndCopierByTheSameNameShouldBothBeFound_TestShell::
createTest(TEST_ComparatorsAndCopiersRepository_ComparatorAndCopierByTheSameNameShouldBothBeFound_TestShell
           *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockNamedValueTest.cpp"
                                  ,0x41);
  TEST_ComparatorsAndCopiersRepository_ComparatorAndCopierByTheSameNameShouldBothBeFound_Test::
  TEST_ComparatorsAndCopiersRepository_ComparatorAndCopierByTheSameNameShouldBothBeFound_Test
            ((TEST_ComparatorsAndCopiersRepository_ComparatorAndCopierByTheSameNameShouldBothBeFound_Test
              *)this_00);
  return this_00;
}

Assistant:

TEST(ComparatorsAndCopiersRepository, ComparatorAndCopierByTheSameNameShouldBothBeFound)
{
  MyComparator comparator;
  MyCopier copier;
  MockNamedValueComparatorsAndCopiersRepository repository;
  repository.installCopier("MyType", copier);
  repository.installComparator("MyType", comparator);
  POINTERS_EQUAL(&comparator, repository.getComparatorForType("MyType"));
  POINTERS_EQUAL(&copier, repository.getCopierForType("MyType"));
  repository.clear();
}